

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitSimdMemAccess
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature,ViewType viewType,
          uint8 dataWidth,bool isStore)

{
  byte bVar1;
  uint32 uVar2;
  RegSlot location_;
  WasmReaderBase *pWVar3;
  WasmCompilationException *this_00;
  WasmRegisterSpace *this_01;
  EmitInfo EStack_64;
  RegSlot resultReg;
  EmitInfo exprInfo;
  EmitInfo local_54;
  EmitInfo rhsInfo;
  uint offset;
  uint alignment;
  uint32 naturalAlignment;
  WasmType type;
  bool isStore_local;
  uint8 dataWidth_local;
  ViewType viewType_local;
  WasmType *signature_local;
  WasmBytecodeGenerator *pWStack_18;
  OpCodeAsmJs op_local;
  WasmBytecodeGenerator *this_local;
  EmitInfo yieldInfo;
  
  alignment = *signature;
  naturalAlignment._1_1_ = isStore;
  naturalAlignment._2_1_ = dataWidth;
  naturalAlignment._3_1_ = viewType;
  _type = signature;
  signature_local._6_2_ = op;
  pWStack_18 = this;
  SetUsesMemory(this,0);
  pWVar3 = GetReader(this);
  bVar1 = (pWVar3->m_currentNode).field_1.mem.alignment;
  pWVar3 = GetReader(this);
  uVar2 = (pWVar3->m_currentNode).field_1.brTable.numTargets;
  if (0x10 < bVar1) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,L"alignment must not be larger than natural");
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  EmitInfo::EmitInfo(&local_54);
  if ((naturalAlignment._1_1_ & 1) != 0) {
    exprInfo = PopEvalStack(this,alignment,L"Invalid type for store op");
    local_54 = exprInfo;
  }
  EStack_64 = PopEvalStack(this,FirstLocalType,L"Index expression must be of type i32");
  if ((naturalAlignment._1_1_ & 1) == 0) {
    this_01 = GetRegisterSpace(this,alignment);
    location_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_01);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x16])
              (this->m_writer,(ulong)signature_local._6_2_,(ulong)location_,
               (ulong)EStack_64 & 0xffffffff,(ulong)naturalAlignment._2_1_,
               (ulong)naturalAlignment._3_1_,uVar2);
    EmitInfo::EmitInfo((EmitInfo *)&this_local,location_,&alignment);
    ReleaseLocation(this,&stack0xffffffffffffff9c);
  }
  else {
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x16])
              (this->m_writer,(ulong)signature_local._6_2_,(ulong)local_54 & 0xffffffff,
               (ulong)EStack_64 & 0xffffffff,(ulong)naturalAlignment._2_1_,
               (ulong)naturalAlignment._3_1_,uVar2);
    ReleaseLocation(this,&local_54);
    ReleaseLocation(this,&stack0xffffffffffffff9c);
    EmitInfo::EmitInfo((EmitInfo *)&this_local);
  }
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSimdMemAccess(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature, Js::ArrayBufferView::ViewType viewType, uint8 dataWidth, bool isStore)
{

    WasmTypes::WasmType type = signature[0];
    SetUsesMemory(0);

    const uint32 naturalAlignment = 16;
    const uint alignment = GetReader()->m_currentNode.mem.alignment;
    const uint offset = GetReader()->m_currentNode.mem.offset;

    if (alignment > naturalAlignment)
    {
        throw WasmCompilationException(_u("alignment must not be larger than natural"));
    }

    EmitInfo rhsInfo;
    if (isStore)
    {
        rhsInfo = PopEvalStack(type, _u("Invalid type for store op"));
    }
    EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));

    if (isStore)
    {
        m_writer->AsmSimdTypedArr(op, rhsInfo.location, exprInfo.location, dataWidth, viewType, offset);

        ReleaseLocation(&rhsInfo);
        ReleaseLocation(&exprInfo);

        return EmitInfo();
    }

    Js::RegSlot resultReg = GetRegisterSpace(type)->AcquireTmpRegister();
    m_writer->AsmSimdTypedArr(op, resultReg, exprInfo.location, dataWidth, viewType, offset);

    EmitInfo yieldInfo = EmitInfo(resultReg, type);
    ReleaseLocation(&exprInfo);

    return yieldInfo;
}